

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

int Bac_BoxBo(Bac_Ntk_t *p,int b,int i)

{
  int iVar1;
  int i_local;
  int b_local;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_ObjIsBox(p,b);
  if (iVar1 != 0) {
    return b + 1 + i;
  }
  __assert_fail("Bac_ObjIsBox(p, b)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                ,0x134,"int Bac_BoxBo(Bac_Ntk_t *, int, int)");
}

Assistant:

static inline int            Bac_BoxBo( Bac_Ntk_t * p, int b, int i )        { assert(Bac_ObjIsBox(p, b)); return b + 1 + i;                                               }